

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_bss_section.hpp
# Opt level: O3

error_code __thiscall
pstore::exchange::import_ns::
bss_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
::end_object(bss_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
             *this)

{
  section_content **ppsVar1;
  tuple<pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
  this_00;
  pointer *__ptr;
  pointer __p;
  error_code eVar2;
  error_or<pstore::repo::section_content_*> c;
  __uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
  local_48;
  _Head_base<0UL,_pstore::repo::bss_section_creation_dispatcher_*,_false> local_40;
  error_or<pstore::repo::section_content_*> local_38;
  not_null<const_pstore::repo::section_content_*> local_20;
  
  content_object(&local_38,this);
  if (local_38.has_error_ == true) {
    eVar2 = error_or<pstore::repo::section_content_*>::get_error(&local_38);
  }
  else {
    ppsVar1 = error_or<pstore::repo::section_content*>::
              value_storage_impl<pstore::error_or<pstore::repo::section_content*>const&,pstore::repo::section_content*const>
                        (&local_38);
    this_00.
    super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
    .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          )operator_new(0x18);
    local_20.ptr_ = *ppsVar1;
    gsl::not_null<const_pstore::repo::section_content_*>::ensure_invariant(&local_20);
    repo::bss_section_creation_dispatcher::bss_section_creation_dispatcher
              ((bss_section_creation_dispatcher *)
               this_00.
               super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
               .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>.
               _M_head_impl,local_20);
    local_40._M_head_impl = (bss_section_creation_dispatcher *)0x0;
    local_48._M_t.
    super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
    .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl =
         (tuple<pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          )(tuple<pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
            )this_00.
             super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
             .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl
    ;
    std::
    vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
    ::
    emplace_back<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>
              ((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
                *)((this->out_).ptr_)->container,
               (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
                *)&local_48);
    if ((_Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
         )local_48._M_t.
          super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl !=
        (section_creation_dispatcher *)0x0) {
      (**(code **)(*(long *)local_48._M_t.
                            super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
                            .
                            super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>
                            ._M_head_impl + 8))();
    }
    local_48._M_t.
    super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
    .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl =
         (tuple<pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          )(_Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
            )0x0;
    std::
    unique_ptr<pstore::repo::bss_section_creation_dispatcher,_std::default_delete<pstore::repo::bss_section_creation_dispatcher>_>
    ::~unique_ptr((unique_ptr<pstore::repo::bss_section_creation_dispatcher,_std::default_delete<pstore::repo::bss_section_creation_dispatcher>_>
                   *)&local_40);
    eVar2 = rule::pop(&this->super_rule);
  }
  if (local_38.has_error_ == false) {
    error_or<pstore::repo::section_content*>::
    value_storage_impl<pstore::error_or<pstore::repo::section_content*>&,pstore::repo::section_content*>
              (&local_38);
  }
  else {
    error_or<pstore::repo::section_content*>::
    error_storage_impl<pstore::error_or<pstore::repo::section_content*>&,std::error_code>(&local_38)
    ;
  }
  eVar2._4_4_ = 0;
  return eVar2;
}

Assistant:

std::error_code bss_section<OutputIterator>::end_object () {
                error_or<repo::section_content *> const c = this->content_object ();
                if (!c) {
                    return c.get_error ();
                }
                *out_ = std::make_unique<
                    repo::section_to_creation_dispatcher<repo::bss_section>::type> (c.get ());
                return pop ();
            }